

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

void __thiscall
mp::internal::TextReader<fmt::Locale>::ReadHeader(TextReader<fmt::Locale> *this,NLHeader *header)

{
  int *piVar1;
  int iVar2;
  char *loc;
  bool bVar3;
  int iVar4;
  unsigned_long uVar5;
  long lVar6;
  double dVar7;
  int arith_kind;
  int max_vars;
  int local_4c;
  double local_48 [2];
  ArgList local_38;
  
  loc = (this->super_ReaderBase).ptr_;
  (this->super_ReaderBase).token_ = loc;
  (this->super_ReaderBase).ptr_ = loc + 1;
  if (*loc == 'b') {
    (header->super_NLInfo).super_NLInfo_C.format = 1;
  }
  else if (*loc == 'g') {
    (header->super_NLInfo).super_NLInfo_C.format = 0;
  }
  else {
    local_38.field_1.values_ = (Value *)local_48;
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_38.types_ = 0;
    DoReportError(this,loc,(CStringRef)0x4bcd5c,&local_38);
  }
  piVar1 = &(header->super_NLInfo).super_NLInfo_C.num_ampl_options;
  SkipSpace(this);
  ReadIntWithoutSign<int>(this,piVar1);
  if (9 < (header->super_NLInfo).super_NLInfo_C.num_ampl_options) {
    local_38.field_1.values_ = (Value *)local_48;
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_38.types_ = 0;
    DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x4bcd76,&local_38);
  }
  if (0 < *piVar1) {
    lVar6 = 0;
    while( true ) {
      bVar3 = ReadOptionalDouble(this,local_48);
      if (!bVar3) break;
      (header->super_NLInfo).super_NLInfo_C.ampl_options[lVar6] = (long)local_48[0];
      dVar7 = (double)(long)local_48[0];
      if (((local_48[0] != dVar7) || (NAN(local_48[0]) || NAN(dVar7))) ||
         (lVar6 = lVar6 + 1, *piVar1 <= lVar6)) break;
    }
  }
  if ((header->super_NLInfo).super_NLInfo_C.ampl_options[1] == 3) {
    ReadOptionalDouble(this,&(header->super_NLInfo).super_NLInfo_C.ampl_vbtol);
  }
  ReadTillEndOfLine(this);
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_vars = iVar4;
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons = iVar4;
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_objs = iVar4;
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_eqns = -1;
  SkipSpace(this);
  bVar3 = ReadIntWithoutSign<int>
                    (this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_ranges);
  if (bVar3) {
    SkipSpace(this);
    bVar3 = ReadIntWithoutSign<int>
                      (this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_eqns);
    if (bVar3) {
      SkipSpace(this);
      ReadIntWithoutSign<int>
                (this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
    }
  }
  ReadTillEndOfLine(this);
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_cons = iVar4;
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_objs = iVar4;
  SkipSpace(this);
  bVar3 = ReadIntWithoutSign<int>
                    (this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_conds);
  if (bVar3) {
    SkipSpace(this);
    bVar3 = ReadIntWithoutSign<int>
                      (this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_compl_conds)
    ;
    if (bVar3) {
      SkipSpace(this);
      bVar3 = ReadIntWithoutSign<int>
                        (this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.
                               num_compl_dbl_ineqs);
      if (bVar3) {
        SkipSpace(this);
        bVar3 = ReadIntWithoutSign<int>
                          (this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.
                                 num_compl_vars_with_nz_lb);
        goto LAB_004997a4;
      }
    }
  }
  bVar3 = false;
LAB_004997a4:
  iVar2 = (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_compl_conds;
  piVar1 = &(header->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_conds;
  iVar4 = *piVar1;
  *piVar1 = *piVar1 + iVar2;
  if ((*piVar1 != 0 && SCARRY4(iVar4,iVar2) == *piVar1 < 0) && bVar3 == false) {
    (header->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_dbl_ineqs = -1;
  }
  ReadTillEndOfLine(this);
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_net_cons = iVar4;
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_cons = iVar4;
  ReadTillEndOfLine(this);
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons = iVar4;
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs = iVar4;
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both = -1;
  SkipSpace(this);
  ReadIntWithoutSign<int>
            (this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both);
  ReadTillEndOfLine(this);
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_vars = iVar4;
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs = iVar4;
  local_4c = 0;
  SkipSpace(this);
  bVar3 = ReadIntWithoutSign<int>(this,&local_4c);
  if (bVar3) {
    if (5 < local_4c) {
      local_38.field_1.values_ = (Value *)local_48;
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_38.types_ = 0;
      DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x4bcd87,&local_38);
    }
    (header->super_NLInfo).super_NLInfo_C.arith_kind = local_4c;
    SkipSpace(this);
    ReadIntWithoutSign<int>(this,&(header->super_NLInfo).super_NLInfo_C.flags);
  }
  ReadTillEndOfLine(this);
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars = iVar4;
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars = iVar4;
  if (-1 < (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both) {
    iVar4 = ReadUInt<int>(this);
    (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both = iVar4;
    iVar4 = ReadUInt<int>(this);
    (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons = iVar4;
    iVar4 = ReadUInt<int>(this);
    (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs = iVar4;
  }
  ReadTillEndOfLine(this);
  uVar5 = ReadUInt<unsigned_long>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_con_nonzeros = uVar5;
  uVar5 = ReadUInt<unsigned_long>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_obj_nonzeros = uVar5;
  ReadTillEndOfLine(this);
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.max_con_name_len = iVar4;
  iVar4 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.max_var_name_len = iVar4;
  ReadTillEndOfLine(this);
  local_48[0] = (double)CONCAT44(local_48[0]._4_4_,
                                 (header->super_NLProblemInfo).super_NLProblemInfo_C.num_vars);
  iVar4 = ReadUInt(this,(int *)local_48);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both = iVar4;
  iVar4 = ReadUInt(this,(int *)local_48);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons = iVar4;
  iVar4 = ReadUInt(this,(int *)local_48);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs = iVar4;
  iVar4 = ReadUInt(this,(int *)local_48);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons = iVar4;
  iVar4 = ReadUInt(this,(int *)local_48);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs = iVar4;
  ReadTillEndOfLine(this);
  return;
}

Assistant:

void mp::internal::TextReader<Locale>::ReadHeader(NLHeader &header) {
  // Read the format (text or binary).
  switch (ReadChar()) {
  case 'g':
    header.format = NLHeader::TEXT;
    break;
  case 'b':
    header.format = NLHeader::BINARY;
    break;
  default:
    ReportError("expected format specifier");
    break;
  }

  // Read options.
  ReadOptionalUInt(header.num_ampl_options);
  if (header.num_ampl_options > MAX_AMPL_OPTIONS)
    ReportError("too many options");
  for (int i = 0; i < header.num_ampl_options; ++i) {
    double tmp;
    if (!ReadOptionalDouble(tmp))
      break;
    header.ampl_options[i] = (long)tmp;
    if (header.ampl_options[i] != tmp)
      break;
  }
  if (header.ampl_options[USE_VBTOL_OPTION] == READ_VBTOL)
    ReadOptionalDouble(header.ampl_vbtol);
  ReadTillEndOfLine();

  // Read problem dimensions.
  header.num_vars = ReadUInt();
  header.num_algebraic_cons = ReadUInt();
  header.num_objs = ReadUInt();
  header.num_eqns = -1;
  if (ReadOptionalUInt(header.num_ranges) &&
      ReadOptionalUInt(header.num_eqns)) {
      ReadOptionalUInt(header.num_logical_cons);
  }
  ReadTillEndOfLine();

  // Read the nonlinear and complementarity information.
  header.num_nl_cons = ReadUInt();
  header.num_nl_objs = ReadUInt();
  bool all_compl =
      ReadOptionalUInt(header.num_compl_conds) &&
      ReadOptionalUInt(header.num_nl_compl_conds) &&
      ReadOptionalUInt(header.num_compl_dbl_ineqs) &&
      ReadOptionalUInt(header.num_compl_vars_with_nz_lb);
  header.num_compl_conds += header.num_nl_compl_conds;
  if (header.num_compl_conds > 0 && !all_compl)
    header.num_compl_dbl_ineqs = -1;
  ReadTillEndOfLine();

  // Read the information about network constraints.
  header.num_nl_net_cons = ReadUInt();
  header.num_linear_net_cons = ReadUInt();
  ReadTillEndOfLine();

  // Read the information about nonlinear variables.
  header.num_nl_vars_in_cons = ReadUInt();
  header.num_nl_vars_in_objs = ReadUInt();
  header.num_nl_vars_in_both = -1;
  ReadOptionalUInt(header.num_nl_vars_in_both);
  ReadTillEndOfLine();

  header.num_linear_net_vars = ReadUInt();
  header.num_funcs = ReadUInt();
  int arith_kind = 0;
  if (ReadOptionalUInt(arith_kind)) {
    if (arith_kind > arith::LAST)
      ReportError("unknown floating-point arithmetic kind");
    header.arith_kind = arith_kind;
    ReadOptionalUInt(header.flags);
  }
  ReadTillEndOfLine();

  // Read the information about discrete variables.
  header.num_linear_binary_vars = ReadUInt();
  header.num_linear_integer_vars = ReadUInt();
  if (header.num_nl_vars_in_both >= 0) {  // ampl versions >= 19930630
    header.num_nl_integer_vars_in_both = ReadUInt();
    header.num_nl_integer_vars_in_cons = ReadUInt();
    header.num_nl_integer_vars_in_objs = ReadUInt();
  }
  ReadTillEndOfLine();

  // Read the information about nonzeros.
  header.num_con_nonzeros = ReadUInt<std::size_t>();
  header.num_obj_nonzeros = ReadUInt<std::size_t>();
  ReadTillEndOfLine();

  // Read the information about names.
  header.max_con_name_len = ReadUInt();
  header.max_var_name_len = ReadUInt();
  ReadTillEndOfLine();

  // Read the information about common expressions checking for overflow
  // as the variable indices go from 0 to num_vars + num_common_exprs.
  int max_vars = header.num_vars;
  header.num_common_exprs_in_both = ReadUInt(max_vars);
  header.num_common_exprs_in_cons = ReadUInt(max_vars);
  header.num_common_exprs_in_objs = ReadUInt(max_vars);
  header.num_common_exprs_in_single_cons = ReadUInt(max_vars);
  header.num_common_exprs_in_single_objs = ReadUInt(max_vars);
  ReadTillEndOfLine();
}